

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

tuple<double,_double> calcSum(TKeyWaveformF *waveform,int is0,int is1)

{
  float fVar1;
  int in_ECX;
  int is;
  long lVar2;
  undefined4 in_register_00000034;
  _Head_base<1UL,_double,_false> _Var3;
  pointer pfVar4;
  _Head_base<0UL,_double,_false> in_XMM1_Qa;
  tuple<double,_double> tVar5;
  
  _Var3._M_head_impl = 0.0;
  pfVar4 = (pointer)0x0;
  if (is1 < in_ECX) {
    lVar2 = (long)is1;
    do {
      fVar1 = *(float *)(*(long *)CONCAT44(in_register_00000034,is0) + lVar2 * 4);
      in_XMM1_Qa._M_head_impl = (double)(fVar1 * fVar1);
      _Var3._M_head_impl = _Var3._M_head_impl + in_XMM1_Qa._M_head_impl;
      pfVar4 = (pointer)((double)pfVar4 + (double)fVar1);
      lVar2 = lVar2 + 1;
    } while (in_ECX != lVar2);
  }
  (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)_Var3._M_head_impl;
  (waveform->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_finish = pfVar4;
  tVar5.super__Tuple_impl<0UL,_double,_double>.super__Head_base<0UL,_double,_false>._M_head_impl =
       in_XMM1_Qa._M_head_impl;
  tVar5.super__Tuple_impl<0UL,_double,_double>.super__Tuple_impl<1UL,_double>.
  super__Head_base<1UL,_double,_false>._M_head_impl =
       (_Head_base<1UL,_double,_false>)(_Head_base<1UL,_double,_false>)_Var3._M_head_impl;
  return (tuple<double,_double>)tVar5.super__Tuple_impl<0UL,_double,_double>;
}

Assistant:

std::tuple<double, double> calcSum(const TKeyWaveformF & waveform, int is0, int is1) {
    double sum = 0.0f;
    double sum2 = 0.0f;
    for (int is = is0; is < is1; ++is) {
        auto a0 = waveform[is];
        sum += a0;
        sum2 += a0*a0;
    }

    return std::tuple<double, double>(sum, sum2);
}